

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,OptionStyle style)

{
  ErrorCollector *pEVar1;
  Parser *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  FieldDescriptor *pFVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UninterpretedOption *uninterpreted_option;
  long lVar8;
  string *value;
  pointer pcVar9;
  uint uVar10;
  LocationRecorder *this_01;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  undefined1 local_98 [56];
  LocationRecorder local_60;
  LogFinisher local_4d;
  OptionStyle local_4c;
  LocationRecorder local_48;
  Parser *local_38;
  
  local_4c = style;
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"uninterpreted_option","");
  pFVar6 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar4),(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  local_38 = this;
  if (pFVar6 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
               ,0x3c4);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)local_98,"CHECK failed: uninterpreted_option_field != NULL: ")
    ;
    pLVar7 = internal::LogMessage::operator<<
                       (pLVar7,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)&local_48,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)local_98);
  }
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  iVar4 = *(int *)(pFVar6 + 0x28);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x30))
                    ((long *)CONCAT44(extraout_var_00,iVar5),options,pFVar6);
  LocationRecorder::Init(&local_48,options_location);
  LocationRecorder::AddPath(&local_48,iVar4);
  LocationRecorder::AddPath(&local_48,iVar5);
  this_00 = local_38;
  if ((local_4c != OPTION_STATEMENT) || (bVar2 = Consume(local_38,"option"), bVar2)) {
    iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
    uninterpreted_option =
         (UninterpretedOption *)
         (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x208))
                   ((long *)CONCAT44(extraout_var_01,iVar4),options,pFVar6,0);
    if ((uninterpreted_option != (UninterpretedOption *)0x0) &&
       (lVar8 = __dynamic_cast(uninterpreted_option,&Message::typeinfo,
                               &UninterpretedOption::typeinfo,0), lVar8 == 0)) {
      __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x158,
                    "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::UninterpretedOption *, From = google::protobuf::Message]"
                   );
    }
    LocationRecorder::Init((LocationRecorder *)local_98,&local_48);
    LocationRecorder::AddPath((LocationRecorder *)local_98,2);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_98,(Message *)uninterpreted_option,OPTION_NAME);
    iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    LocationRecorder::Init(&local_60,(LocationRecorder *)local_98);
    LocationRecorder::AddPath(&local_60,iVar4);
    bVar2 = ParseOptionNamePart(this_00,uninterpreted_option,&local_60);
    LocationRecorder::~LocationRecorder(&local_60);
    this_01 = (LocationRecorder *)local_98;
    if (bVar2) {
LAB_0021628d:
      iVar4 = std::__cxx11::string::compare((char *)&(this_00->input_->current_).text);
      if (iVar4 == 0) {
        bVar2 = Consume(this_00,".");
        this_01 = (LocationRecorder *)local_98;
        if (bVar2) goto code_r0x002162af;
      }
      else {
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_98);
        bVar2 = Consume(this_00,"=");
        if (!bVar2) goto LAB_002162ed;
        LocationRecorder::Init(&local_60,&local_48);
        LocationRecorder::RecordLegacyLocation
                  (&local_60,(Message *)uninterpreted_option,OPTION_VALUE);
        bVar2 = TryConsume(this_00,"-");
        switch((this_00->input_->current_).type) {
        case TYPE_START:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_98,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/parser.cc"
                     ,0x3f7);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_98,
                              "Trying to read value before any tokens have been read.");
          internal::LogFinisher::operator=(&local_4d,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_98);
          break;
        case TYPE_END:
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Unexpected end of stream while parsing option value.","");
          pEVar1 = this_00->error_collector_;
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                       (ulong)(uint)(this_00->input_->current_).column,local_98);
          }
          goto LAB_00216596;
        case TYPE_IDENTIFIER:
          LocationRecorder::AddPath(&local_60,3);
          if (!bVar2) {
            local_98._0_8_ = local_98 + 0x10;
            local_98._8_8_ = (Location *)0x0;
            local_98[0x10] = '\0';
            bVar2 = ConsumeIdentifier(this_00,(string *)local_98,"Expected identifier.");
            if (!bVar2) goto LAB_0021659a;
            UninterpretedOption::set_identifier_value(uninterpreted_option,(string *)local_98);
LAB_0021662f:
            if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
              operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
            }
            goto switchD_00216375_default;
          }
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Invalid \'-\' symbol before identifier.","");
          pEVar1 = this_00->error_collector_;
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                       (ulong)(uint)(this_00->input_->current_).column,local_98);
          }
LAB_00216596:
          this_00->had_errors_ = true;
LAB_0021659a:
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
          }
          break;
        case TYPE_INTEGER:
          bVar3 = ConsumeInteger64(this_00,(ulong)bVar2 - 1 | 0x8000000000000000,(uint64 *)local_98,
                                   "Expected integer.");
          if (bVar3) {
            if (bVar2) {
              LocationRecorder::AddPath(&local_60,5);
              lVar8 = 0x38;
              uVar10 = 8;
              pcVar9 = (pointer)-local_98._0_8_;
            }
            else {
              uVar10 = 4;
              LocationRecorder::AddPath(&local_60,4);
              lVar8 = 0x30;
              pcVar9 = (pointer)local_98._0_8_;
            }
            uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | uVar10;
            *(pointer *)((long)uninterpreted_option->_has_bits_ + lVar8 + -0x5c) = pcVar9;
            goto switchD_00216375_default;
          }
          break;
        case TYPE_FLOAT:
          LocationRecorder::AddPath(&local_60,6);
          bVar3 = ConsumeNumber(this_00,(double *)local_98,"Expected number.");
          if (bVar3) {
            pcVar9 = (pointer)local_98._0_8_;
            if (bVar2) {
              pcVar9 = (pointer)(local_98._0_8_ ^ 0x8000000000000000);
            }
            uninterpreted_option->_has_bits_[0] = uninterpreted_option->_has_bits_[0] | 0x10;
            uninterpreted_option->double_value_ = (double)pcVar9;
            goto switchD_00216375_default;
          }
          break;
        case TYPE_STRING:
          LocationRecorder::AddPath(&local_60,7);
          if (bVar2) {
            local_98._0_8_ = local_98 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,"Invalid \'-\' symbol before string.","");
            pEVar1 = this_00->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                         (ulong)(uint)(this_00->input_->current_).column,local_98);
            }
            goto LAB_00216596;
          }
          local_98._0_8_ = local_98 + 0x10;
          local_98._8_8_ = (Location *)0x0;
          local_98[0x10] = '\0';
          bVar2 = ConsumeString(this_00,(string *)local_98,"Expected string.");
          if (bVar2) {
            UninterpretedOption::set_string_value(uninterpreted_option,(string *)local_98);
            goto LAB_0021662f;
          }
          goto LAB_0021659a;
        case TYPE_SYMBOL:
          iVar4 = std::__cxx11::string::compare((char *)&(this_00->input_->current_).text);
          if (iVar4 != 0) {
            local_98._0_8_ = local_98 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,"Expected option value.","");
            pEVar1 = this_00->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this_00->input_->current_).line,
                         (ulong)(uint)(this_00->input_->current_).column,local_98);
            }
            goto LAB_00216596;
          }
          LocationRecorder::AddPath(&local_60,8);
          value = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(uninterpreted_option);
          bVar2 = ParseUninterpretedBlock(this_00,value);
          if (bVar2) goto switchD_00216375_default;
          break;
        default:
switchD_00216375_default:
          LocationRecorder::~LocationRecorder(&local_60);
          if ((local_4c == OPTION_STATEMENT) &&
             (bVar2 = ConsumeEndOfDeclaration(this_00,";",&local_48), !bVar2)) goto LAB_002162ed;
          bVar2 = true;
          goto LAB_002162ef;
        }
        this_01 = &local_60;
      }
    }
LAB_002162e8:
    LocationRecorder::~LocationRecorder(this_01);
  }
LAB_002162ed:
  bVar2 = false;
LAB_002162ef:
  LocationRecorder::~LocationRecorder(&local_48);
  return bVar2;
code_r0x002162af:
  iVar4 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
  LocationRecorder::Init(&local_60,(LocationRecorder *)local_98);
  LocationRecorder::AddPath(&local_60,iVar4);
  bVar2 = ParseOptionNamePart(this_00,uninterpreted_option,&local_60);
  LocationRecorder::~LocationRecorder(&local_60);
  this_01 = (LocationRecorder *)local_98;
  if (!bVar2) goto LAB_002162e8;
  goto LAB_0021628d;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field = options->GetDescriptor()->
      FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option = down_cast<UninterpretedOption*>(
      options->GetReflection()->AddMessage(options,
                                           uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              -static_cast<int64>(value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}